

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O2

int sf_parser_param(sf_parser *sfp,sf_vec *dest_key,sf_value *dest_value)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  uVar2 = sfp->state;
  iVar4 = -1;
  switch(uVar2 & 3) {
  case 0:
    iVar3 = parser_skip_inner_list(sfp);
    if (iVar3 == 0) {
      uVar2 = sfp->state;
      goto switchD_00115a16_caseD_1;
    }
    break;
  case 1:
switchD_00115a16_caseD_1:
    uVar2 = uVar2 & 0xfffffffc | 2;
    sfp->state = uVar2;
  case 2:
    puVar1 = sfp->pos;
    if ((puVar1 == sfp->end) || (*puVar1 != ';')) {
      sfp->state = uVar2 | 3;
      iVar4 = -2;
    }
    else {
      sfp->pos = puVar1 + 1;
      parser_discard_sp(sfp);
      if (sfp->pos != sfp->end) {
        iVar3 = parser_key(sfp,dest_key);
        if (iVar3 == 0) {
          puVar1 = sfp->pos;
          if ((puVar1 == sfp->end) || (*puVar1 != '=')) {
            iVar4 = 0;
            if (dest_value != (sf_value *)0x0) {
              dest_value->type = SF_TYPE_BOOLEAN;
              dest_value->flags = 0;
              (dest_value->field_2).boolean = 1;
            }
          }
          else {
            sfp->pos = puVar1 + 1;
            if (puVar1 + 1 != sfp->end) {
              iVar4 = parser_bare_item(sfp,dest_value);
              return iVar4;
            }
          }
        }
      }
    }
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x283,"int sf_parser_param(sf_parser *, sf_vec *, sf_value *)");
  }
  return iVar4;
}

Assistant:

int sf_parser_param(sf_parser *sfp, sf_vec *dest_key, sf_value *dest_value) {
  int rv;

  switch (sfp->state & SF_STATE_OP_MASK) {
  case SF_STATE_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_BEFORE_PARAMS:
    parser_set_op_state(sfp, SF_STATE_PARAMS);

    break;
  case SF_STATE_PARAMS:
    break;
  default:
    assert(0);
    abort();
  }

  if (parser_eof(sfp) || *sfp->pos != ';') {
    parser_set_op_state(sfp, SF_STATE_AFTER);

    return SF_ERR_EOF;
  }

  ++sfp->pos;

  parser_discard_sp(sfp);
  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  rv = parser_key(sfp, dest_key);
  if (rv != 0) {
    return rv;
  }

  if (parser_eof(sfp) || *sfp->pos != '=') {
    if (dest_value) {
      dest_value->type = SF_TYPE_BOOLEAN;
      dest_value->flags = SF_VALUE_FLAG_NONE;
      dest_value->boolean = 1;
    }

    return 0;
  }

  ++sfp->pos;

  if (parser_eof(sfp)) {
    return SF_ERR_PARSE_ERROR;
  }

  return parser_bare_item(sfp, dest_value);
}